

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

Token * __thiscall
wabt::WastLexer::GetToken(Token *__return_storage_ptr__,WastLexer *this,WastParser *parser)

{
  byte *pbVar1;
  size_type sVar2;
  byte *pbVar3;
  TokenType TVar4;
  long lVar5;
  char *pcVar6;
  byte *pbVar7;
  byte *pbVar8;
  uint uVar9;
  anon_class_8_1_8991fb9c column;
  bool bVar10;
  string_view name;
  
LAB_0016250a:
  do {
    pbVar1 = (byte *)this->buffer_end_;
    pbVar3 = (byte *)this->cursor_;
    this->token_start_ = (char *)pbVar3;
    uVar9 = 0xffffffff;
    if (pbVar3 < pbVar1) {
      uVar9 = (uint)*pbVar3;
    }
    if (0x60 < (int)uVar9) {
      if ((int)uVar9 < 0x6e) {
        if (uVar9 == 0x61) {
          pcVar6 = "align=";
          sVar2 = 6;
          TVar4 = AlignEqNat;
LAB_0016288d:
          name.size_ = sVar2;
          name.data_ = pcVar6;
          GetNameEqNumToken(__return_storage_ptr__,this,name,TVar4);
          return __return_storage_ptr__;
        }
        if (uVar9 == 0x69) {
LAB_0016294d:
          GetInfToken(__return_storage_ptr__,this);
          return __return_storage_ptr__;
        }
      }
      else {
        if (uVar9 == 0x6e) {
LAB_0016295f:
          GetNanToken(__return_storage_ptr__,this);
          return __return_storage_ptr__;
        }
        if (uVar9 == 0x6f) {
          pcVar6 = "offset=";
          sVar2 = 7;
          TVar4 = OffsetEqNat;
          goto LAB_0016288d;
        }
      }
      goto switchD_00162540_caseD_b;
    }
    switch(uVar9) {
    case 9:
    case 10:
    case 0xd:
    case 0x20:
      ReadWhitespace(this);
      break;
    case 0x22:
      GetStringToken(__return_storage_ptr__,this,parser);
      return __return_storage_ptr__;
    case 0x24:
      GetIdToken(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case 0x28:
      bVar10 = false;
      lVar5 = 0;
      pbVar7 = pbVar3;
      do {
        uVar9 = 0xffffffff;
        pbVar8 = pbVar7;
        if (pbVar7 < pbVar1) {
          pbVar8 = pbVar7 + 1;
          this->cursor_ = (char *)pbVar8;
          uVar9 = (uint)*pbVar7;
        }
        if (uVar9 != (int)"(;"[lVar5]) {
          this->cursor_ = (char *)pbVar3;
          break;
        }
        lVar5 = lVar5 + 1;
        bVar10 = lVar5 == 2;
        pbVar7 = pbVar8;
      } while (!bVar10);
      if (bVar10) goto code_r0x0016262f;
      pbVar3 = (byte *)this->cursor_;
      bVar10 = false;
      lVar5 = 0;
      pbVar7 = pbVar3;
      goto LAB_001628be;
    case 0x29:
      if (pbVar3 < pbVar1) {
        this->cursor_ = (char *)(pbVar3 + 1);
      }
      TVar4 = Rpar;
      goto LAB_00162774;
    case 0x2b:
    case 0x2d:
      if (pbVar3 < pbVar1) {
        this->cursor_ = (char *)(pbVar3 + 1);
      }
      pbVar3 = (byte *)this->cursor_;
      uVar9 = 0xffffffff;
      if (pbVar3 < pbVar1) {
        uVar9 = (uint)*pbVar3;
      }
      if (uVar9 - 0x31 < 9) goto LAB_001627a7;
      if (uVar9 == 0x6e) goto LAB_0016295f;
      if (uVar9 == 0x69) goto LAB_0016294d;
      if (uVar9 != 0x30) goto LAB_00162971;
      bVar10 = false;
      lVar5 = 0;
      pbVar7 = pbVar3;
      goto LAB_00162914;
    case 0x30:
      bVar10 = false;
      lVar5 = 0;
      pbVar7 = pbVar3;
      goto LAB_001627e2;
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      goto switchD_00162540_caseD_31;
    case 0x3b:
      bVar10 = false;
      lVar5 = 0;
      pbVar7 = pbVar3;
      do {
        uVar9 = 0xffffffff;
        pbVar8 = pbVar7;
        if (pbVar7 < pbVar1) {
          pbVar8 = pbVar7 + 1;
          this->cursor_ = (char *)pbVar8;
          uVar9 = (uint)*pbVar7;
        }
        if (uVar9 != (int)";;"[lVar5]) {
          this->cursor_ = (char *)pbVar3;
          break;
        }
        lVar5 = lVar5 + 1;
        bVar10 = lVar5 == 2;
        pbVar7 = pbVar8;
      } while (!bVar10);
      pbVar3 = (byte *)this->cursor_;
      if (!bVar10) {
        if (pbVar3 < pbVar1) {
          this->cursor_ = (char *)(pbVar3 + 1);
        }
        goto LAB_00162745;
      }
      do {
        uVar9 = 0xffffffff;
        pbVar7 = pbVar3;
        if (pbVar3 < pbVar1) {
          pbVar7 = pbVar3 + 1;
          this->cursor_ = (char *)pbVar7;
          uVar9 = (uint)*pbVar3;
        }
        if (uVar9 == 0xffffffff) goto LAB_00162764;
        pbVar3 = pbVar7;
      } while (uVar9 != 10);
      this->line_ = this->line_ + 1;
      this->line_start_ = this->cursor_;
      break;
    default:
      if (uVar9 == 0xffffffff) goto LAB_00162764;
    case 0xb:
    case 0xc:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x21:
    case 0x23:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x2a:
    case 0x2c:
    case 0x2e:
    case 0x2f:
    case 0x3a:
switchD_00162540_caseD_b:
      if (pbVar3 < pbVar1) {
        lVar5 = (ulong)*pbVar3 + 1;
      }
      else {
        lVar5 = 0;
      }
      if ((""[lVar5] & 2U) != 0) {
        GetKeywordToken(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
      if (pbVar3 < pbVar1) {
        lVar5 = (ulong)*pbVar3 + 1;
      }
      else {
        lVar5 = 0;
      }
      if ((""[lVar5] & 1U) != 0) {
LAB_00162971:
        GetReservedToken(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
      if (pbVar3 < pbVar1) {
        this->cursor_ = (char *)(pbVar3 + 1);
      }
LAB_00162745:
      WastParser::Error(parser,0x1992eb);
    }
  } while( true );
  while( true ) {
    lVar5 = lVar5 + 1;
    bVar10 = lVar5 == 2;
    pbVar7 = pbVar8;
    if (bVar10) break;
LAB_001627e2:
    uVar9 = 0xffffffff;
    pbVar8 = pbVar7;
    if (pbVar7 < pbVar1) {
      pbVar8 = pbVar7 + 1;
      this->cursor_ = (char *)pbVar8;
      uVar9 = (uint)*pbVar7;
    }
    if (uVar9 != (int)":0x"[lVar5 + 1]) {
      this->cursor_ = (char *)pbVar3;
      break;
    }
  }
  if (bVar10) {
    TVar4 = Last_Literal;
    goto LAB_0016299c;
  }
switchD_00162540_caseD_31:
  TVar4 = Last_Literal;
  goto LAB_001629b3;
code_r0x0016262f:
  bVar10 = ReadBlockComment(this,parser);
  if (!bVar10) goto LAB_00162764;
  goto LAB_0016250a;
LAB_00162764:
  TVar4 = Eof;
  goto LAB_00162774;
  while( true ) {
    lVar5 = lVar5 + 1;
    bVar10 = lVar5 == 2;
    pbVar7 = pbVar8;
    if (bVar10) break;
LAB_00162914:
    uVar9 = 0xffffffff;
    pbVar8 = pbVar7;
    if (pbVar7 < pbVar1) {
      pbVar8 = pbVar7 + 1;
      this->cursor_ = (char *)pbVar8;
      uVar9 = (uint)*pbVar7;
    }
    if (uVar9 != (int)":0x"[lVar5 + 1]) {
      this->cursor_ = (char *)pbVar3;
      break;
    }
  }
  if (bVar10) {
    TVar4 = Int;
LAB_0016299c:
    GetHexNumberToken(__return_storage_ptr__,this,TVar4);
    return __return_storage_ptr__;
  }
LAB_001627a7:
  TVar4 = Int;
LAB_001629b3:
  GetNumberToken(__return_storage_ptr__,this,TVar4);
  return __return_storage_ptr__;
  while( true ) {
    lVar5 = lVar5 + 1;
    bVar10 = lVar5 == 2;
    pbVar7 = pbVar8;
    if (bVar10) break;
LAB_001628be:
    uVar9 = 0xffffffff;
    pbVar8 = pbVar7;
    if (pbVar7 < pbVar1) {
      pbVar8 = pbVar7 + 1;
      this->cursor_ = (char *)pbVar8;
      uVar9 = (uint)*pbVar7;
    }
    if (uVar9 != (int)"(@"[lVar5]) {
      this->cursor_ = (char *)pbVar3;
      break;
    }
  }
  pbVar3 = (byte *)this->cursor_;
  if (bVar10) {
    do {
      if (pbVar3 < pbVar1) {
        lVar5 = (ulong)*pbVar3 + 1;
      }
      else {
        lVar5 = 0;
      }
      do {
        if ((""[lVar5] & 1U) == 0) {
          TextToken(__return_storage_ptr__,this,LparAnn,2);
          return __return_storage_ptr__;
        }
        lVar5 = 0;
      } while (pbVar1 <= pbVar3);
      pbVar3 = pbVar3 + 1;
      this->cursor_ = (char *)pbVar3;
    } while( true );
  }
  if (pbVar3 < pbVar1) {
    this->cursor_ = (char *)(pbVar3 + 1);
  }
  TVar4 = Lpar;
LAB_00162774:
  BareToken(__return_storage_ptr__,this,TVar4);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetToken(WastParser* parser) {
  while (true) {
    token_start_ = cursor_;
    switch (PeekChar()) {
      case kEof:
        return BareToken(TokenType::Eof);

      case '(':
        if (MatchString("(;")) {
          if (ReadBlockComment(parser)) {
            continue;
          }
          return BareToken(TokenType::Eof);
        } else if (MatchString("(@")) {
          ReadReservedChars();
          // offset=2 to skip the "(@" prefix
          return TextToken(TokenType::LparAnn, 2);
        } else {
          ReadChar();
          return BareToken(TokenType::Lpar);
        }
        break;

      case ')':
        ReadChar();
        return BareToken(TokenType::Rpar);

      case ';':
        if (MatchString(";;")) {
          if (ReadLineComment()) {
            continue;
          }
          return BareToken(TokenType::Eof);
        } else {
          ReadChar();
          ERROR("unexpected char");
          continue;
        }
        break;

      case ' ':
      case '\t':
      case '\r':
      case '\n':
        ReadWhitespace();
        continue;

      case '"':
        return GetStringToken(parser);

      case '+':
      case '-':
        ReadChar();
        switch (PeekChar()) {
          case 'i':
            return GetInfToken();

          case 'n':
            return GetNanToken();

          case '0':
            return MatchString("0x") ? GetHexNumberToken(TokenType::Int)
                                     : GetNumberToken(TokenType::Int);
          case '1':
          case '2':
          case '3':
          case '4':
          case '5':
          case '6':
          case '7':
          case '8':
          case '9':
            return GetNumberToken(TokenType::Int);

          default:
            return GetReservedToken();
        }
        break;

      case '0':
        return MatchString("0x") ? GetHexNumberToken(TokenType::Nat)
                                 : GetNumberToken(TokenType::Nat);

      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
        return GetNumberToken(TokenType::Nat);

      case '$':
        return GetIdToken();

      case 'a':
        return GetNameEqNumToken("align=", TokenType::AlignEqNat);

      case 'i':
        return GetInfToken();

      case 'n':
        return GetNanToken();

      case 'o':
        return GetNameEqNumToken("offset=", TokenType::OffsetEqNat);

      default:
        if (IsKeyword(PeekChar())) {
          return GetKeywordToken();
        } else if (IsReserved(PeekChar())) {
          return GetReservedToken();
        } else {
          ReadChar();
          ERROR("unexpected char");
          continue;
        }
    }
  }
}